

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void double_conversion::FillDigits32(uint32_t number,Vector<char> buffer,int *length)

{
  char cVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  piVar3 = buffer._8_8_;
  pcVar5 = buffer.start_;
  lVar6 = 0;
  for (; number != 0; number = number / 10) {
    pcVar5[lVar6 + *piVar3] = (byte)(number % 10) | 0x30;
    lVar6 = lVar6 + 1;
  }
  lVar4 = (long)((int)lVar6 + *piVar3);
  for (lVar2 = (long)*piVar3; lVar4 = lVar4 + -1, lVar2 < lVar4; lVar2 = lVar2 + 1) {
    cVar1 = pcVar5[lVar2];
    pcVar5[lVar2] = pcVar5[lVar4];
    pcVar5[lVar4] = cVar1;
  }
  *piVar3 = *piVar3 + (int)lVar6;
  return;
}

Assistant:

static void FillDigits32(uint32_t number, Vector<char> buffer, int* length) {
  int number_length = 0;
  // We fill the digits in reverse order and exchange them afterwards.
  while (number != 0) {
    int digit = number % 10;
    number /= 10;
    buffer[(*length) + number_length] = static_cast<char>('0' + digit);
    number_length++;
  }
  // Exchange the digits.
  int i = *length;
  int j = *length + number_length - 1;
  while (i < j) {
    char tmp = buffer[i];
    buffer[i] = buffer[j];
    buffer[j] = tmp;
    i++;
    j--;
  }
  *length += number_length;
}